

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Legendre
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,int nderiv)

{
  long row;
  TPZFMatrix<double> *this;
  double *pdVar1;
  long lVar2;
  long lVar3;
  long row_00;
  ulong uVar4;
  REAL value;
  double local_68;
  TPZFMatrix<double> *local_60;
  double local_58;
  REAL x_local;
  ulong local_48;
  double local_40;
  double local_38;
  
  if (0 < num) {
    value = 1.0;
    local_60 = phi;
    x_local = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&value);
    value = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&value);
    lVar2 = (long)nderiv;
    for (lVar3 = 1; lVar3 < lVar2; lVar3 = lVar3 + 1) {
      value = 0.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,lVar3,0,&value);
    }
    if (num != 1) {
      (*(local_60->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x20])(local_60,1,0,&x_local);
      value = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1,&value);
      for (lVar3 = 1; lVar3 < lVar2; lVar3 = lVar3 + 1) {
        value = 0.0;
        (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(dphi,lVar3,1,&value);
      }
      local_48 = (ulong)(uint)num;
      for (uVar4 = 2; this = local_60, uVar4 != local_48; uVar4 = uVar4 + 1) {
        local_38 = (double)(int)uVar4;
        lVar3 = uVar4 - 1;
        local_40 = (double)(int)lVar3;
        local_58 = local_40 + local_40 + 1.0;
        local_68 = x_local * local_58;
        pdVar1 = TPZFMatrix<double>::operator()(local_60,lVar3,0);
        row = uVar4 - 2;
        local_68 = local_68 * *pdVar1;
        pdVar1 = TPZFMatrix<double>::operator()(this,row,0);
        value = (local_68 - local_40 * *pdVar1) / local_38;
        (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(this,uVar4,0,&value);
        pdVar1 = TPZFMatrix<double>::operator()(this,lVar3,0);
        local_68 = *pdVar1 * local_58;
        pdVar1 = TPZFMatrix<double>::operator()(dphi,0,row);
        value = local_68 + *pdVar1;
        (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(dphi,0,uVar4,&value);
        for (row_00 = 1; row_00 < lVar2; row_00 = row_00 + 1) {
          pdVar1 = TPZFMatrix<double>::operator()(dphi,row_00 + -1,lVar3);
          local_68 = *pdVar1 * local_58;
          pdVar1 = TPZFMatrix<double>::operator()(dphi,row_00,row);
          value = local_68 + *pdVar1;
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,row_00,uVar4,&value);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Legendre(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, int nderiv){
		
		// Quadratic or higher shape functions
		if (num <= 0) return;
		phi.Put(0, 0, 1.0);
		dphi.Put(0, 0, 0.0);
		
		int ideriv;
		for (ideriv = 1; ideriv < nderiv; ideriv++)
			dphi.Put(ideriv, 0, 0.0);
		
		
		if (num == 1) return;
		
		phi.Put(1, 0, x);
		dphi.Put(0, 1, 1.0);
		
		for (ideriv = 1; ideriv < nderiv; ideriv++)
			dphi.Put(ideriv, 1, 0.0);
		
		int ord;
		//Aqui fica diferente do Chebyshev
		REAL ord_real, value;
		for (ord = 2; ord < num; ord++)
		{
			//casting int ord to REAL ord_real
			ord_real = (REAL)ord;
			//computing the ord_th function
			value    = ( (2.0 * (ord_real - 1.0) + 1.0) * x * phi(ord - 1, 0) - (ord_real - 1.0) * phi(ord - 2 , 0) ) / (ord_real);
			phi.Put(ord, 0, value);
			
			//computing the ord_th function's derivative
			value    = (2.0 * (ord_real - 1.0) + 1.0) * phi(ord - 1, 0) + dphi(0, ord - 2);
			dphi.Put(0, ord, value);
			
			for (ideriv = 1; ideriv < nderiv; ideriv++){
				value = (2.0 * (ord_real - 1.0) + 1.0) * dphi(ideriv - 1, ord - 1) + dphi(ideriv, ord - 2);
				dphi.Put(ideriv, ord, value);	    	 
			}
			
		}
		
#ifdef PZDEBUG
		int printing = 0;
		if (printing){
			cout << "Legendre" << endl;
			for(ord = 0; ord < num; ord++)
			{
				cout << "x = " << x << endl;
				cout << "phi(" << ord << ", 0) = " << phi(ord, 0) << endl;
				cout << "dphi(0, " << ord << " = " << dphi(0, ord) << endl;
				cout << endl;
			}
		}
#endif
		
	}